

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O1

CURLUcode parse_authority(Curl_URL *u,char *auth,size_t authlen,uint flags,dynbuf *host,
                         _Bool has_scheme)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  dynbuf *pdVar4;
  CURLcode CVar5;
  int iVar6;
  int iVar7;
  CURLUcode CVar8;
  void *pvVar9;
  Curl_handler *pCVar10;
  char *pcVar11;
  char *pcVar12;
  size_t sVar13;
  ulong uVar14;
  ulong uVar15;
  char **optionsp_00;
  ulong uVar16;
  undefined7 in_register_00000089;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  bool bVar20;
  char *passwdp;
  char *userp;
  char *optionsp;
  char *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  dynbuf *local_48;
  uint local_3c;
  char *local_38;
  
  local_3c = (uint)CONCAT71(in_register_00000089,has_scheme);
  CVar8 = CURLUE_OK;
  local_58 = (char *)0x0;
  local_60 = (char *)0x0;
  local_38 = (char *)0x0;
  local_48 = host;
  pvVar9 = memchr(auth,0x40,authlen);
  if (pvVar9 == (void *)0x0) {
LAB_0016733a:
    (*Curl_cfree)(local_58);
    (*Curl_cfree)(local_60);
    (*Curl_cfree)(local_38);
    u->user = (char *)0x0;
    u->password = (char *)0x0;
    u->options = (char *)0x0;
    lVar19 = 0;
  }
  else {
    if (u->scheme == (char *)0x0) {
      pCVar10 = (Curl_handler *)0x0;
    }
    else {
      pCVar10 = Curl_get_scheme_handler(u->scheme);
    }
    lVar19 = (long)pvVar9 + (1 - (long)auth);
    if ((pCVar10 == (Curl_handler *)0x0) || ((pCVar10->flags & 0x400) == 0)) {
      optionsp_00 = (char **)0x0;
    }
    else {
      optionsp_00 = &local_38;
    }
    CVar5 = Curl_parse_login_details(auth,lVar19 - 1,(char **)&local_58,&local_60,optionsp_00);
    CVar8 = CURLUE_BAD_LOGIN;
    if (CVar5 != CURLE_OK) goto LAB_0016733a;
    if (local_58 != (char *)0x0) {
      CVar8 = CURLUE_USER_NOT_ALLOWED;
      if ((flags & 0x20) != 0) goto LAB_0016733a;
      (*Curl_cfree)(u->user);
      u->user = local_58;
    }
    if (local_60 != (char *)0x0) {
      (*Curl_cfree)(u->password);
      u->password = local_60;
    }
    CVar8 = CURLUE_OK;
    if (local_38 != (char *)0x0) {
      (*Curl_cfree)(u->options);
      u->options = local_38;
    }
  }
  pdVar4 = local_48;
  if (CVar8 != CURLUE_OK) {
    return CVar8;
  }
  CVar5 = Curl_dyn_addn(local_48,auth + lVar19,authlen - lVar19);
  if (CVar5 != CURLE_OK) {
    if (CVar5 != CURLE_TOO_LARGE) {
      return CURLUE_OUT_OF_MEMORY;
    }
    return CURLUE_TOO_LARGE;
  }
  pcVar11 = Curl_dyn_ptr(pdVar4);
  if (*pcVar11 == '[') {
    pcVar12 = strchr(pcVar11,0x5d);
    if (pcVar12 == (char *)0x0) {
      CVar8 = CURLUE_BAD_IPV6;
      local_58 = (char *)0x0;
      goto LAB_0016753d;
    }
    local_58 = pcVar12 + 1;
    if (pcVar12[1] != ':') {
      CVar8 = CURLUE_BAD_PORT_NUMBER;
      if (pcVar12[1] != '\0') goto LAB_0016753d;
      local_58 = (char *)0x0;
    }
  }
  else {
    local_58 = strchr(pcVar11,0x3a);
  }
  if (local_58 != (char *)0x0) {
    Curl_dyn_setlen(local_48,(long)local_58 - (long)pcVar11);
    if (local_58[1] == '\0') {
      CVar8 = (uint)(byte)((byte)local_3c ^ 1) << 2;
      local_58 = local_58 + 1;
LAB_00167534:
      bVar20 = false;
    }
    else {
      local_58 = local_58 + 1;
      iVar6 = Curl_str_number((char **)&local_58,(curl_off_t *)&local_60,0xffff);
      CVar8 = CURLUE_BAD_PORT_NUMBER;
      if ((iVar6 != 0) || (*local_58 != '\0')) goto LAB_00167534;
      u->portnum = (unsigned_short)local_60;
      (*Curl_cfree)(u->port);
      pcVar11 = curl_maprintf("%ld",local_60);
      u->port = pcVar11;
      bVar20 = pcVar11 != (char *)0x0;
      CVar8 = CURLUE_OUT_OF_MEMORY;
    }
    if (!bVar20) goto LAB_0016753d;
  }
  CVar8 = CURLUE_OK;
LAB_0016753d:
  pdVar4 = local_48;
  if (CVar8 == CURLUE_OK) {
    sVar13 = Curl_dyn_len(local_48);
    if (sVar13 == 0) {
      CVar8 = CURLUE_NO_HOST;
    }
    else {
      local_60 = Curl_dyn_ptr(pdVar4);
      local_58 = (char *)0x0;
      uStack_50 = 0;
      uVar18 = 3;
      if (*local_60 != '[') {
        bVar20 = false;
        iVar6 = 0;
        do {
          pdVar4 = local_48;
          uVar16 = uStack_50;
          pcVar11 = local_58;
          if (bVar20) {
            CVar5 = CURLE_OK;
            uVar2 = local_58._4_4_;
            uVar3 = (uint)uStack_50;
            switch(iVar6) {
            case 0:
              Curl_dyn_reset(local_48);
              uVar15 = (ulong)((uint)local_58 >> 0x18);
              uVar14 = (ulong)((uint)local_58 >> 0x10 & 0xff);
              uVar16 = (ulong)((uint)local_58 >> 8 & 0xff);
              uVar17 = (ulong)((uint)local_58 & 0xff);
              break;
            case 1:
              uVar18 = 1;
              if (0xffffff < local_58._4_4_ || 0xff < (uint)local_58) goto LAB_001677eb;
              Curl_dyn_reset(local_48);
              uVar14 = (ulong)(uVar2 >> 0x10);
              uVar16 = (ulong)(uVar2 >> 8 & 0xff);
              uVar15 = (ulong)pcVar11 & 0xffffffff;
              uVar17 = (ulong)(uVar2 & 0xff);
              break;
            case 2:
              uVar18 = 1;
              if (0xffff < (uint)uStack_50 || (0xff < local_58._4_4_ || 0xff < (uint)local_58))
              goto LAB_001677eb;
              Curl_dyn_reset(local_48);
              uVar16 = (ulong)(uVar3 >> 8);
              uVar17 = (ulong)(uVar3 & 0xff);
              uVar15 = (ulong)pcVar11 & 0xffffffff;
              uVar14 = (ulong)uVar2;
              break;
            case 3:
              uVar2 = uStack_50._4_4_;
              uVar18 = 1;
              if ((0xff < uStack_50._4_4_ || 0xff < (uint)uStack_50) ||
                  (0xff < local_58._4_4_ || 0xff < (uint)local_58)) goto LAB_001677eb;
              local_3c = local_58._4_4_;
              Curl_dyn_reset(local_48);
              uVar15 = (ulong)pcVar11 & 0xffffffff;
              uVar14 = (ulong)local_3c;
              uVar16 = uVar16 & 0xffffffff;
              uVar17 = (ulong)uVar2;
              break;
            default:
              goto switchD_00167669_default;
            }
            CVar5 = Curl_dyn_addf(pdVar4,"%u.%u.%u.%u",uVar15,uVar14,uVar16,uVar17);
switchD_00167669_default:
            uVar18 = -(uint)(CVar5 != CURLE_OK) | 2;
            goto LAB_001677eb;
          }
          if (*local_60 == '0') {
            if (local_60[1] == 'x') {
              local_60 = local_60 + 2;
              iVar7 = Curl_str_hex(&local_60,(curl_off_t *)&local_38,0xffffffff);
            }
            else {
              iVar7 = Curl_str_octal(&local_60,(curl_off_t *)&local_38,0xffffffff);
            }
          }
          else {
            iVar7 = Curl_str_number(&local_60,(curl_off_t *)&local_38,0xffffffff);
          }
          if (iVar7 == 0) {
            *(undefined4 *)((long)&local_58 + (long)iVar6 * 4) = local_38._0_4_;
            if (*local_60 != '\0') {
              if (*local_60 == '.') {
                if (iVar6 != 3) {
                  iVar6 = iVar6 + 1;
                  local_60 = local_60 + 1;
                  goto LAB_00167639;
                }
                iVar6 = 3;
              }
              goto LAB_001675f7;
            }
            bVar20 = true;
LAB_00167639:
            bVar1 = true;
          }
          else {
LAB_001675f7:
            bVar1 = false;
          }
        } while (bVar1);
        uVar18 = 1;
      }
LAB_001677eb:
      pdVar4 = local_48;
      switch(uVar18) {
      case 0:
        CVar8 = urldecode_host(local_48);
        pdVar4 = local_48;
        if (CVar8 == CURLUE_OK) {
          pcVar11 = Curl_dyn_ptr(local_48);
          sVar13 = Curl_dyn_len(pdVar4);
          CVar8 = hostname_check(u,pcVar11,sVar13);
        }
        break;
      case 1:
        CVar8 = CURLUE_OK;
        break;
      case 2:
        pcVar11 = Curl_dyn_ptr(local_48);
        sVar13 = Curl_dyn_len(pdVar4);
        CVar8 = ipv6_parse(u,pcVar11,sVar13);
        break;
      default:
        CVar8 = CURLUE_BAD_HOSTNAME;
      }
    }
  }
  return CVar8;
}

Assistant:

static CURLUcode parse_authority(struct Curl_URL *u,
                                 const char *auth, size_t authlen,
                                 unsigned int flags,
                                 struct dynbuf *host,
                                 bool has_scheme)
{
  size_t offset;
  CURLUcode uc;
  CURLcode result;

  /*
   * Parse the login details and strip them out of the hostname.
   */
  uc = parse_hostname_login(u, auth, authlen, flags, &offset);
  if(uc)
    goto out;

  result = Curl_dyn_addn(host, auth + offset, authlen - offset);
  if(result) {
    uc = cc2cu(result);
    goto out;
  }

  uc = Curl_parse_port(u, host, has_scheme);
  if(uc)
    goto out;

  if(!Curl_dyn_len(host))
    return CURLUE_NO_HOST;

  switch(ipv4_normalize(host)) {
  case HOST_IPV4:
    break;
  case HOST_IPV6:
    uc = ipv6_parse(u, Curl_dyn_ptr(host), Curl_dyn_len(host));
    break;
  case HOST_NAME:
    uc = urldecode_host(host);
    if(!uc)
      uc = hostname_check(u, Curl_dyn_ptr(host), Curl_dyn_len(host));
    break;
  case HOST_ERROR:
    uc = CURLUE_OUT_OF_MEMORY;
    break;
  default:
    uc = CURLUE_BAD_HOSTNAME; /* Bad IPv4 address even */
    break;
  }

out:
  return uc;
}